

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp_sample.c
# Opt level: O0

HTTP_CLIENT_HANDLE
create_uhttp_client_handle(HTTP_SAMPLE_INFO *sample_info,char *host_name,int port_num)

{
  HTTP_CLIENT_HANDLE pHVar1;
  IO_INTERFACE_DESCRIPTION *local_70;
  IO_INTERFACE_DESCRIPTION *interface_desc;
  void *xio_param;
  TLSIO_CONFIG tls_io_config;
  SOCKETIO_CONFIG config;
  int port_num_local;
  char *host_name_local;
  HTTP_SAMPLE_INFO *sample_info_local;
  
  if (port_num == 0x1bb) {
    tls_io_config.port = 0;
    tls_io_config._12_4_ = 0;
    tls_io_config.underlying_io_interface = (IO_INTERFACE_DESCRIPTION *)0x0;
    interface_desc = (IO_INTERFACE_DESCRIPTION *)&xio_param;
    xio_param = host_name;
    tls_io_config.hostname._0_4_ = port_num;
    local_70 = platform_get_default_tlsio();
  }
  else {
    interface_desc =
         (IO_INTERFACE_DESCRIPTION *)&tls_io_config.invoke_on_send_complete_callback_for_fragments;
    tls_io_config._32_8_ = host_name;
    local_70 = socketio_get_interface_description();
  }
  pHVar1 = uhttp_client_create(local_70,interface_desc,on_error,sample_info);
  return pHVar1;
}

Assistant:

static HTTP_CLIENT_HANDLE create_uhttp_client_handle(HTTP_SAMPLE_INFO* sample_info, const char* host_name, int port_num)
{
    SOCKETIO_CONFIG config;
    TLSIO_CONFIG tls_io_config;
    const void* xio_param;
    const IO_INTERFACE_DESCRIPTION* interface_desc;
    if (port_num == HTTPS_PORT_NUM)
    {
        tls_io_config.hostname = host_name;
        tls_io_config.port = port_num;
        tls_io_config.underlying_io_interface = NULL;
        tls_io_config.underlying_io_parameters = NULL;
        xio_param = &tls_io_config;
        // Get the TLS definition
        interface_desc = platform_get_default_tlsio();
    }
    else
    {
        config.accepted_socket = NULL;
        config.hostname = host_name;
        config.port = port_num;
        xio_param = &config;
        // Get the socket definition
        interface_desc = socketio_get_interface_description();
    }
    return uhttp_client_create(interface_desc, xio_param, on_error, sample_info);
}